

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_diag_mask_inf(ggml_context *ctx,ggml_tensor *a,int n_past)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RSI;
  ggml_tensor *b;
  ggml_tensor *result;
  _Bool is_node;
  undefined4 in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  ggml_context *in_stack_ffffffffffffffd0;
  
  if (in_RSI->grad == (ggml_tensor *)0x0) {
    pgVar1 = ggml_view_tensor(in_stack_ffffffffffffffd0,
                              (ggml_tensor *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    pgVar2 = ggml_new_i32(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    pgVar1->op = GGML_OP_DIAG_MASK_INF;
    pgVar1->grad = (ggml_tensor *)0x0;
    pgVar1->src0 = in_RSI;
    pgVar1->src1 = pgVar2;
    return pgVar1;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xfb4,
          "false");
  abort();
}

Assistant:

struct ggml_tensor * ggml_diag_mask_inf(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   n_past) {
    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    // TODO: when implement backward, fix this:
    //struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);
    struct ggml_tensor * result = ggml_view_tensor(ctx, a);
    struct ggml_tensor * b = ggml_new_i32(ctx, n_past);

    result->op   = GGML_OP_DIAG_MASK_INF;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}